

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void gl4cts::EnhancedLayouts::Utils::clearPtrVector<gl4cts::EnhancedLayouts::Utils::Interface>
               (vector<gl4cts::EnhancedLayouts::Utils::Interface_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Interface_*>_>
                *vector)

{
  Interface *pIVar1;
  reference ppIVar2;
  Interface *t;
  size_t i;
  vector<gl4cts::EnhancedLayouts::Utils::Interface_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Interface_*>_>
  *vector_local;
  
  for (t = (Interface *)0x0;
      pIVar1 = (Interface *)
               std::
               vector<gl4cts::EnhancedLayouts::Utils::Interface_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Interface_*>_>
               ::size(vector), t < pIVar1;
      t = (Interface *)
          ((long)&(t->m_members).
                  super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1)) {
    ppIVar2 = std::
              vector<gl4cts::EnhancedLayouts::Utils::Interface_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Interface_*>_>
              ::operator[](vector,(size_type)t);
    pIVar1 = *ppIVar2;
    ppIVar2 = std::
              vector<gl4cts::EnhancedLayouts::Utils::Interface_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Interface_*>_>
              ::operator[](vector,(size_type)t);
    *ppIVar2 = (value_type)0x0;
    if ((pIVar1 != (Interface *)0x0) && (pIVar1 != (Interface *)0x0)) {
      Interface::~Interface(pIVar1);
      operator_delete(pIVar1,0x40);
    }
  }
  std::
  vector<gl4cts::EnhancedLayouts::Utils::Interface_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Interface_*>_>
  ::clear(vector);
  return;
}

Assistant:

void clearPtrVector(std::vector<T*>& vector)
{
	for (size_t i = 0; i < vector.size(); ++i)
	{
		T* t = vector[i];

		vector[i] = 0;

		if (0 != t)
		{
			delete t;
		}
	}

	vector.clear();
}